

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O0

int jpc_pchglist_insert(jpc_pchglist_t *pchglist,int pchgno,jpc_pchg_t *pchg)

{
  int iVar1;
  jpc_pchg_t **ppjVar2;
  jpc_pchg_t **newpchgs;
  int newmaxpchgs;
  int i;
  jpc_pchg_t *pchg_local;
  int pchgno_local;
  jpc_pchglist_t *pchglist_local;
  
  pchg_local._4_4_ = pchgno;
  if (pchgno < 0) {
    pchg_local._4_4_ = pchglist->numpchgs;
  }
  if (pchglist->maxpchgs <= pchglist->numpchgs) {
    iVar1 = pchglist->maxpchgs + 0x80;
    ppjVar2 = (jpc_pchg_t **)jas_realloc2(pchglist->pchgs,(long)iVar1,8);
    if (ppjVar2 == (jpc_pchg_t **)0x0) {
      return -1;
    }
    pchglist->maxpchgs = iVar1;
    pchglist->pchgs = ppjVar2;
  }
  for (newpchgs._4_4_ = pchglist->numpchgs; pchg_local._4_4_ < newpchgs._4_4_;
      newpchgs._4_4_ = newpchgs._4_4_ + -1) {
    pchglist->pchgs[newpchgs._4_4_] = pchglist->pchgs[newpchgs._4_4_ + -1];
  }
  pchglist->pchgs[pchg_local._4_4_] = pchg;
  pchglist->numpchgs = pchglist->numpchgs + 1;
  return 0;
}

Assistant:

int jpc_pchglist_insert(jpc_pchglist_t *pchglist, int pchgno, jpc_pchg_t *pchg)
{
	int i;
	int newmaxpchgs;
	jpc_pchg_t **newpchgs;
	if (pchgno < 0) {
		pchgno = pchglist->numpchgs;
	}
	if (pchglist->numpchgs >= pchglist->maxpchgs) {
		newmaxpchgs = pchglist->maxpchgs + 128;
		if (!(newpchgs = jas_realloc2(pchglist->pchgs, newmaxpchgs,
		  sizeof(jpc_pchg_t *)))) {
			return -1;
		}
		pchglist->maxpchgs = newmaxpchgs;
		pchglist->pchgs = newpchgs;
	}
	for (i = pchglist->numpchgs; i > pchgno; --i) {
		pchglist->pchgs[i] = pchglist->pchgs[i - 1];
	}
	pchglist->pchgs[pchgno] = pchg;
	++pchglist->numpchgs;
	return 0;
}